

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

int duckdb::History::Load(char *filename)

{
  bool bVar1;
  int iVar2;
  char *buf;
  string result;
  undefined1 *puStack_96088;
  undefined8 uStack_96080;
  undefined1 auStack_96078 [16];
  LineReader reader;
  
  bVar1 = LineReader::Init(&reader,filename);
  if (bVar1) {
    result._M_dataplus._M_p = (pointer)&result.field_2;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    while( true ) {
      bVar1 = LineReader::NextLine(&reader);
      if (!bVar1) break;
      if ((result._M_string_length == 0) && (reader.line_buffer[0] == '.')) {
        Add(reader.line_buffer);
      }
      else {
        ::std::__cxx11::string::append((char *)&result);
        iVar2 = duckdb_shell_sqlite3_complete(result._M_dataplus._M_p);
        if (iVar2 == 0) {
          ::std::__cxx11::string::append((char *)&result);
        }
        else {
          Add(result._M_dataplus._M_p,result._M_string_length);
          uStack_96080 = 0;
          auStack_96078[0] = 0;
          puStack_96088 = auStack_96078;
          ::std::__cxx11::string::operator=((string *)&result,(string *)&puStack_96088);
          ::std::__cxx11::string::~string((string *)&puStack_96088);
        }
      }
    }
    LineReader::Close(&reader);
    history_file = strdup(filename);
    ::std::__cxx11::string::~string((string *)&result);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int History::Load(const char *filename) {
	LineReader reader;
	if (!reader.Init(filename)) {
		return -1;
	}

	std::string result;
	while (reader.NextLine()) {
		auto buf = reader.GetLine();
		if (result.empty() && buf[0] == '.') {
			// if the first character is a dot this is a dot command
			// add the full line to the history
			History::Add(buf);
			continue;
		}
		// else we are parsing a SQL statement
		result += buf;
		if (sqlite3_complete(result.c_str())) {
			// this line contains a full SQL statement - add it to the history
			History::Add(result.c_str(), result.size());
			result = std::string();
			continue;
		}
		// the result does not contain a full SQL statement - add a newline deliminator and move on to the next line
		result += "\r\n";
	}
	reader.Close();

	history_file = strdup(filename);
	return 0;
}